

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_Font * ON_Font::GetManagedFont(double point_size,wchar_t *face_name)

{
  ON_Font *pOVar1;
  bool in_CL;
  
  pOVar1 = GetManagedFont((ON_Font *)face_name,point_size,(wchar_t *)0x0,false,in_CL);
  return pOVar1;
}

Assistant:

const ON_Font* ON_Font::GetManagedFont(
  double point_size,
  const wchar_t* face_name
  )
{
  const bool bBold = false;
  const bool bItalic = false;

  return ON_Font::GetManagedFont(
    point_size,
    face_name,
    bBold,
    bItalic
    );
}